

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  undefined1 auVar1 [16];
  bool bVar2;
  EnumValueDescriptor *pEVar3;
  reference ppEVar4;
  DescriptorPool *pDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  EnumValuesByNumberSet *this_01;
  string enum_value_name;
  EnumValueDescriptor *result;
  Tables *tables;
  MutexLockMaybe l2;
  iterator it_1;
  ParentNumberQuery query;
  iterator it;
  undefined1 local_258 [32];
  long *local_238;
  long local_230;
  long local_228 [2];
  string *local_218;
  EnumValueDescriptor *local_210;
  _Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false> local_208;
  undefined8 *local_200;
  char *local_1f8;
  undefined8 local_1f0;
  char acStack_1e8 [8];
  long *local_1e0 [2];
  long local_1d0 [2];
  AlphaNum local_1c0;
  iterator local_190;
  key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> local_180;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  local_170;
  long local_90;
  long *local_88;
  AlphaNum local_60;
  
  pEVar3 = FindEnumValueByNumber(this,parent,number);
  if (pEVar3 == (EnumValueDescriptor *)0x0) {
    local_180.query.first = parent;
    local_180.query.second = number;
    absl::lts_20240722::Mutex::ReaderLock();
    this_01 = &this->unknown_enum_values_by_number_;
    local_170.pointers_.payload_._0_16_ =
         absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                   (&this_01->
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ,&local_180);
    local_1c0.piece_._M_len = 0;
    bVar2 = absl::lts_20240722::container_internal::operator==
                      ((iterator *)&local_170,(iterator *)&local_1c0);
    if (!bVar2) {
      ppEVar4 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::iterator::operator*((iterator *)&local_170);
      pEVar3 = *ppEVar4;
    }
    absl::lts_20240722::Mutex::ReaderUnlock();
    if (bVar2) {
      absl::lts_20240722::Mutex::Lock();
      local_190 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                            (&this_01->
                              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ,&local_180);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_170.pointers_.payload_.
                     super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value;
      local_170.pointers_.payload_._0_16_ = auVar1 << 0x40;
      bVar2 = absl::lts_20240722::container_internal::operator==(&local_190,(iterator *)&local_170);
      if (bVar2) {
        local_170.pointers_.payload_.
        super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .value = (PointerT<std::__cxx11::basic_string<char>_>)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::
                 Dispatch<std::__cxx11::string>;
        local_170.pointers_.payload_.super_Base<char>.value = (PointerT<char>)parent->all_names_;
        local_170.pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
             (PointerT<google::protobuf::SourceCodeInfo>)(ulong)(uint)number;
        local_170.pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
             (PointerT<google::protobuf::FileDescriptorTables>)
             absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
        absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                  (&local_238,"UNKNOWN_ENUM_VALUE_%s_%d",0x18,(iterator *)&local_170,2);
        pDVar5 = DescriptorPool::internal_generated_pool();
        DescriptorProto::GetMetadata((DescriptorProto *)&_DescriptorProto_default_instance_);
        pb::CppFeatures::GetMetadata((CppFeatures *)&pb::_CppFeatures_default_instance_);
        local_208._M_head_impl =
             (pDVar5->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
        memset(&local_170,0,0xe0);
        anon_unknown_23::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<google::protobuf::EnumValueDescriptor>(&local_170,1);
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&local_170,2);
        local_1c0.piece_._M_len = (size_t)pDVar5->mutex_;
        if ((Mutex *)local_1c0.piece_._M_len != (Mutex *)0x0) {
          absl::lts_20240722::Mutex::Lock();
        }
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&local_170,&local_208._M_head_impl);
        absl::lts_20240722::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&local_1c0);
        pEVar3 = anon_unknown_23::
                 FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ::AllocateArray<google::protobuf::EnumValueDescriptor>(&local_170,1);
        local_1c0.piece_._M_str = parent->all_names_[1]._M_dataplus._M_p;
        local_1c0.piece_._M_len = parent->all_names_[1]._M_string_length;
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = ".";
        local_90 = local_230;
        local_88 = local_238;
        local_210 = pEVar3;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_258,&local_1c0,&local_60);
        this_00 = (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::AllocateArray<std::__cxx11::string>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)&local_170,2);
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e0,local_238,local_230 + (long)local_238);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_1e0);
        local_200 = &local_1f0;
        if ((undefined1 *)local_258._0_8_ == local_258 + 0x10) {
          acStack_1e8[0] = local_258[0x18];
          acStack_1e8[1] = local_258[0x19];
          acStack_1e8[2] = local_258[0x1a];
          acStack_1e8[3] = local_258[0x1b];
          acStack_1e8[4] = local_258[0x1c];
          acStack_1e8[5] = local_258[0x1d];
          acStack_1e8[6] = local_258[0x1e];
          acStack_1e8[7] = local_258[0x1f];
        }
        else {
          local_200 = (undefined8 *)local_258._0_8_;
        }
        local_1f0 = CONCAT71(local_258._17_7_,local_258[0x10]);
        local_1f8 = (char *)local_258._8_8_;
        local_258._8_8_ = (char *)0x0;
        local_258[0x10] = '\0';
        local_258._0_8_ = local_258 + 0x10;
        local_218 = this_00;
        std::__cxx11::string::operator=((string *)(this_00 + 1),(string *)&local_200);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        pEVar3->all_names_ = local_218;
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        pEVar3->number_ = number;
        pEVar3->type_ = parent;
        pEVar3->options_ = (EnumValueOptions *)&_EnumValueOptions_default_instance_;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        ::insert<google::protobuf::EnumValueDescriptor_*,_0,_0>
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
                    *)&local_1c0,
                   &this_01->
                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   ,&local_210);
        if (local_238 != local_228) {
          operator_delete(local_238,local_228[0] + 1);
        }
      }
      else {
        ppEVar4 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::iterator::operator*(&local_190);
        pEVar3 = *ppEVar4;
      }
      absl::lts_20240722::Mutex::Unlock();
    }
  }
  return pEVar3;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const auto* value = FindEnumValueByNumber(parent, number);
    if (value != nullptr) {
      return value;
    }
  }

  const ParentNumberQuery query{{parent, number}};

  // Second try, with reader lock held on unknown enum values: common case.
  {
    absl::ReaderMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    absl::WriterMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name =
        absl::StrFormat("UNKNOWN_ENUM_VALUE_%s_%d", parent->name(), number);
    auto* pool = DescriptorPool::generated_pool();
    auto* tables = const_cast<DescriptorPool::Tables*>(pool->tables_.get());
    internal::FlatAllocator alloc;
    alloc.PlanArray<EnumValueDescriptor>(1);
    alloc.PlanArray<std::string>(2);

    {
      // Must lock the pool because we will do allocations in the shared arena.
      absl::MutexLockMaybe l2(pool->mutex_);
      alloc.FinalizePlanning(tables);
    }
    EnumValueDescriptor* result = alloc.AllocateArray<EnumValueDescriptor>(1);
    result->all_names_ = alloc.AllocateStrings(
        enum_value_name,
        absl::StrCat(parent->full_name(), ".", enum_value_name));
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    unknown_enum_values_by_number_.insert(result);
    return result;
  }
}